

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pki.cpp
# Opt level: O1

int __thiscall
Vault::Pki::sign(Pki *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  string local_90;
  Path local_70;
  Url local_50;
  
  client = *(Client **)ctx;
  Vault::operator+(&local_90,"sign/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)sig);
  paVar1 = &local_70.value_.field_2;
  paVar2 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    local_70.value_.field_2._8_8_ = local_90.field_2._8_8_;
    local_70.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.value_._M_dataplus._M_p = local_90._M_dataplus._M_p;
  }
  local_70.value_.field_2._M_allocated_capacity._1_7_ = local_90.field_2._M_allocated_capacity._1_7_
  ;
  local_70.value_.field_2._M_local_buf[0] = local_90.field_2._M_local_buf[0];
  local_70.value_._M_string_length = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  getUrl(&local_50,(Pki *)ctx,&local_70);
  HttpConsumer::post((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,client,&local_50,(Parameters *)siglen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value_._M_dataplus._M_p != &local_50.value_.field_2) {
    operator_delete(local_50.value_._M_dataplus._M_p,
                    local_50.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return (int)this;
}

Assistant:

std::optional<std::string>
Vault::Pki::sign(const Path &path, const Parameters &parameters) const {
  return HttpConsumer::post(client_, getUrl(Path{"sign/" + path}), parameters);
}